

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.cpp
# Opt level: O0

void __thiscall
SCCTest_TwoAndOneRedundant_Test::~SCCTest_TwoAndOneRedundant_Test
          (SCCTest_TwoAndOneRedundant_Test *this)

{
  SCCTest_TwoAndOneRedundant_Test *this_local;
  
  ~SCCTest_TwoAndOneRedundant_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SCCTest, TwoAndOneRedundant) {
  // 2 <- 0 <-> 1 -> 2
  Graph graph(3);
  graph.addEdge(0, 1);
  graph.addEdge(1, 0);
  graph.addEdge(1, 2);
  // New from previous, doesn't affect result.
  graph.addEdge(0, 2);
  EXPECT_EQ(getSCCs(graph), (SCCSet{{0, 1}, {2}}));
}